

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_t sVar1;
  long lVar2;
  bool verbose;
  int iVar3;
  Extrapolation extX;
  Extrapolation extY;
  int iVar4;
  long *plVar5;
  char *pcVar6;
  Header *pHVar7;
  undefined8 *puVar8;
  invalid_argument *piVar9;
  ostream *poVar10;
  uint uVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  char *__s2;
  char *__s1;
  LevelRoundingMode local_284;
  allocator<char> local_279;
  Compression local_278;
  int local_274;
  long local_270;
  undefined8 local_268;
  long local_260;
  Compression c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_250;
  long local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  MultiPartInputFile input;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_218;
  long local_208;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  doNotFilter;
  stringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  doNotFilter._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &doNotFilter._M_t._M_impl.super__Rb_tree_header._M_header;
  doNotFilter._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  doNotFilter._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_268 = 0;
  doNotFilter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  doNotFilter._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       doNotFilter._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (argc < 2) {
    iVar4 = -1;
    anon_unknown.dwarf_104fe::usageMessage((ostream *)&std::cerr,*argv,false);
  }
  else {
    iVar4 = argc + -2;
    local_274 = argc + -3;
    local_278 = ZIP_COMPRESSION;
    local_260 = 0x40;
    extY = CLAMP;
    pcVar6 = (char *)0x0;
    __s2 = (char *)0x0;
    local_284 = ROUND_DOWN;
    verbose = false;
    extX = CLAMP;
    local_208 = 0x40;
    local_270 = 0;
    uVar11 = 1;
    do {
      __s1 = argv[uVar11];
      if (*__s1 == '-') {
        if ((__s1[1] == 'o') && (__s1[2] == '\0')) {
          local_268 = 0;
          __s1 = __s2;
          goto LAB_00105841;
        }
        if ((__s1[1] == 'm') && (__s1[2] == '\0')) {
          iVar3 = 1;
          local_268 = 1;
        }
        else {
          if ((__s1[1] == 'r') && (__s1[2] == '\0')) {
            local_268 = 2;
            __s1 = __s2;
            goto LAB_00105841;
          }
          if ((__s1[1] == 'f') && (__s1[2] == '\0')) {
            if (iVar4 < (int)uVar11) {
              piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(piVar9,"missing filter value with -f option");
              goto LAB_00106065;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,argv[(ulong)uVar11 + 1],(allocator<char> *)&input);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&doNotFilter,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
            uVar12 = local_1a8[0]._M_allocated_capacity;
            _Var13._M_p = _e;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_e != local_1a8) {
LAB_00105a7b:
              operator_delete(_Var13._M_p,uVar12 + 1);
            }
LAB_00105a83:
            iVar3 = 2;
          }
          else if ((__s1[1] == 'e') && (__s1[2] == '\0')) {
            if (local_274 < (int)uVar11) {
              piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (piVar9,"missing extrapolation values with -e option");
              goto LAB_00106065;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,argv[(ulong)uVar11 + 1],(allocator<char> *)&input);
            extX = anon_unknown.dwarf_104fe::getExtrapolation((string *)&e);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_e != local_1a8) {
              operator_delete(_e,local_1a8[0]._M_allocated_capacity + 1);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,argv[(ulong)uVar11 + 2],(allocator<char> *)&input);
            extY = anon_unknown.dwarf_104fe::getExtrapolation((string *)&e);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_e != local_1a8) {
              operator_delete(_e,local_1a8[0]._M_allocated_capacity + 1);
            }
            iVar3 = 3;
          }
          else {
            if ((__s1[1] == 't') && (__s1[2] == '\0')) {
              if (local_274 < (int)uVar11) {
                piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument(piVar9,"missing tile size with -t option");
              }
              else {
                local_208 = strtol(argv[(ulong)uVar11 + 1],(char **)0x0,0);
                local_260 = strtol(argv[(ulong)uVar11 + 2],(char **)0x0,0);
                if (0 < (int)local_208) {
                  iVar3 = 3;
                  if (0 < (int)local_260) goto LAB_00105846;
                }
                piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument
                          (piVar9,"Tile size must be greater than zero");
              }
              goto LAB_00106065;
            }
            if ((__s1[1] == 'd') && (__s1[2] == '\0')) {
              local_284 = ROUND_DOWN;
              __s1 = __s2;
              goto LAB_00105841;
            }
            if ((__s1[1] == 'u') && (__s1[2] == '\0')) {
              iVar3 = 1;
              local_284 = ROUND_UP;
            }
            else {
              if ((__s1[1] == 'z') && (__s1[2] == '\0')) {
                if ((int)uVar11 <= iVar4) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_250,argv[(ulong)uVar11 + 1],&local_279);
                  Imf_3_4::getCompressionIdFromName((string *)&local_250,&c);
                  local_278 = c;
                  if (c == NUM_COMPRESSION_METHODS) {
                    std::__cxx11::stringstream::stringstream((stringstream *)&e);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8[0]._M_local_buf,"Unknown compression method \"",
                               0x1c);
                    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1a8[0]._M_local_buf,
                                         local_250->_M_local_buf,local_248);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
                    piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
                    std::__cxx11::stringbuf::str();
                    std::invalid_argument::invalid_argument(piVar9,(string *)&input);
                    __cxa_throw(piVar9,&std::invalid_argument::typeinfo,
                                std::invalid_argument::~invalid_argument);
                  }
                  uVar12 = local_240._M_allocated_capacity;
                  _Var13._M_p = (pointer)local_250;
                  if (local_250 != &local_240) goto LAB_00105a7b;
                  goto LAB_00105a83;
                }
                piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument
                          (piVar9,"Missing compression value with -z option");
                goto LAB_00106065;
              }
              if ((__s1[1] == 'v') && (__s1[2] == '\0')) {
                verbose = true;
                __s1 = __s2;
                goto LAB_00105841;
              }
              if ((__s1[1] != 'p') || (__s1[2] != '\0')) {
                if ((__s1[1] != 'h') || (__s1[2] != '\0')) goto LAB_00105808;
                goto LAB_00105b52;
              }
              if (iVar4 < (int)uVar11) {
                piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument(piVar9,"Missing part num with -p option");
                goto LAB_00106065;
              }
              local_270 = strtol(argv[(ulong)uVar11 + 1],(char **)0x0,0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"part number: ",0xd);
              plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)local_270);
              std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
              std::ostream::put((char)plVar5);
              iVar3 = 2;
              std::ostream::flush();
            }
          }
        }
      }
      else {
LAB_00105808:
        iVar3 = strcmp(__s1,"--help");
        if (iVar3 == 0) {
LAB_00105b52:
          anon_unknown.dwarf_104fe::usageMessage((ostream *)&std::cout,"exrmaketiled",true);
          goto LAB_00105dc1;
        }
        iVar3 = strcmp(__s1,"--version");
        if (iVar3 == 0) {
          pcVar6 = (char *)Imf_3_4::getLibraryVersion();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"exrmaketiled (OpenEXR) ",0x17);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3.4.0",5);
          iVar4 = strcmp(pcVar6,"3.4.0");
          if (iVar4 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"(OpenEXR version ",0x11);
            poVar10 = std::operator<<((ostream *)&std::cout,pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," https://openexr.com",0x14);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Copyright (c) Contributors to the OpenEXR Project",0x31)
          ;
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"License BSD-3-Clause",0x14);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          goto LAB_00105dc1;
        }
        if (pcVar6 == (char *)0x0) {
          pcVar6 = __s1;
          __s1 = __s2;
        }
LAB_00105841:
        iVar3 = 1;
        __s2 = __s1;
      }
LAB_00105846:
      uVar11 = uVar11 + iVar3;
    } while ((int)uVar11 < argc);
    if (__s2 != (char *)0x0 && pcVar6 != (char *)0x0) {
      iVar4 = strcmp(pcVar6,__s2);
      if (iVar4 == 0) {
        piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar9,"Input and output cannot be the same file");
LAB_00106065:
        __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      iVar4 = Imf_3_4::globalThreadCount();
      lVar2 = local_270;
      Imf_3_4::MultiPartInputFile::MultiPartInputFile(&input,pcVar6,iVar4,true);
      iVar4 = Imf_3_4::MultiPartInputFile::parts();
      iVar3 = (int)lVar2;
      if ((iVar3 < 0) || (iVar4 <= iVar3)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8[0]._M_local_buf,"You asked for part ",0x13);
        poVar10 = (ostream *)
                  std::ostream::operator<<((ostream *)local_1a8[0]._M_local_buf,(int)local_270);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," in ",4);
        poVar10 = std::operator<<(poVar10,pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,", which only has ",0x11);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," parts",6);
        piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(piVar9,(string *)&local_250);
        __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      pHVar7 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&input);
      Imf_3_4::Header::Header((Header *)&e,pHVar7);
      puVar8 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
      sVar1 = puVar8[1];
      if ((sVar1 != _DAT_0010f410) ||
         ((sVar1 != 0 &&
          (iVar4 = bcmp((void *)*puVar8,Imf_3_4::DEEPTILE_abi_cxx11_,sVar1), iVar4 != 0)))) {
        puVar8 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
        sVar1 = puVar8[1];
        if ((sVar1 != _DAT_0010f3f0) ||
           ((sVar1 != 0 &&
            (iVar4 = bcmp((void *)*puVar8,Imf_3_4::DEEPSCANLINE_abi_cxx11_,sVar1), iVar4 != 0)))) {
          Imf_3_4::Header::~Header((Header *)&e);
          if (local_218 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218);
          }
          if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228);
          }
          makeTiled(pcVar6,__s2,iVar3,(LevelMode)local_268,local_284,local_278,(int)local_208,
                    (int)local_260,&doNotFilter,extX,extY,verbose);
LAB_00105dc1:
          iVar4 = 0;
          goto LAB_00105dc3;
        }
      }
      piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar9,"Cannot make tile for deep data");
      __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    iVar4 = -1;
    anon_unknown.dwarf_104fe::usageMessage((ostream *)&std::cerr,*argv,false);
  }
LAB_00105dc3:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&doNotFilter._M_t);
  return iVar4;
}

Assistant:

int
main (int argc, char** argv)
{
    const char*       inFile       = 0;
    const char*       outFile      = 0;
    LevelMode         mode         = ONE_LEVEL;
    LevelRoundingMode roundingMode = ROUND_DOWN;
    Compression       compression  = ZIP_COMPRESSION;
    int               tileSizeX    = 64;
    int               tileSizeY    = 64;
    set<string>       doNotFilter;
    Extrapolation     extX    = CLAMP;
    Extrapolation     extY    = CLAMP;
    bool              verbose = false;

    //
    // Parse the command line.
    //

    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    try
    {
        int i       = 1;
        int partnum = 0;

        while (i < argc)
        {
            if (!strcmp (argv[i], "-o"))
            {
                //
                // generate a ONE_LEVEL image
                //

                mode = ONE_LEVEL;
                i += 1;
            }
            else if (!strcmp (argv[i], "-m"))
            {
                //
                // Generate a MIPMAP_LEVELS image
                //

                mode = MIPMAP_LEVELS;
                i += 1;
            }
            else if (!strcmp (argv[i], "-r"))
            {
                //
                // Generate a RIPMAP_LEVELS image
                //

                mode = RIPMAP_LEVELS;
                i += 1;
            }
            else if (!strcmp (argv[i], "-f"))
            {
                //
                // Don't low-pass filter the specified image channel
                //

                if (i > argc - 2)
                    throw invalid_argument (
                        "missing filter value with -f option");

                doNotFilter.insert (argv[i + 1]);
                i += 2;
            }
            else if (!strcmp (argv[i], "-e"))
            {
                //
                // Set x and y extrapolation method
                //

                if (i > argc - 3)
                    throw invalid_argument (
                        "missing extrapolation values with -e option");

                extX = getExtrapolation (argv[i + 1]);
                extY = getExtrapolation (argv[i + 2]);
                i += 3;
            }
            else if (!strcmp (argv[i], "-t"))
            {
                //
                // Set tile size
                //

                if (i > argc - 3)
                    throw invalid_argument ("missing tile size with -t option");

                tileSizeX = strtol (argv[i + 1], 0, 0);
                tileSizeY = strtol (argv[i + 2], 0, 0);

                if (tileSizeX <= 0 || tileSizeY <= 0)
                    throw invalid_argument (
                        "Tile size must be greater than zero");

                i += 3;
            }
            else if (!strcmp (argv[i], "-d"))
            {
                //
                // Round down
                //

                roundingMode = ROUND_DOWN;
                i += 1;
            }
            else if (!strcmp (argv[i], "-u"))
            {
                //
                // Round down
                //

                roundingMode = ROUND_UP;
                i += 1;
            }
            else if (!strcmp (argv[i], "-z"))
            {
                //
                // Set compression method
                //

                if (i > argc - 2)
                    throw invalid_argument (
                        "Missing compression value with -z option");

                compression = getCompression (argv[i + 1]);
                i += 2;
            }
            else if (!strcmp (argv[i], "-v"))
            {
                //
                // Verbose mode
                //

                verbose = true;
                i += 1;
            }
            else if (!strcmp (argv[i], "-p"))
            {
                getPartNum (argc, argv, i, &partnum);
            }
            else if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
            {
                //
                // Print help message
                //

                usageMessage (cout, "exrmaketiled", true);
                return 0;
            }
            else if (!strcmp (argv[i], "--version"))
            {
                const char* libraryVersion = getLibraryVersion ();

                cout << "exrmaketiled (OpenEXR) " << OPENEXR_VERSION_STRING;
                if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                    cout << "(OpenEXR version " << libraryVersion << ")";
                cout << " https://openexr.com" << endl;
                cout << "Copyright (c) Contributors to the OpenEXR Project"
                     << endl;
                cout << "License BSD-3-Clause" << endl;
                return 0;
            }
            else
            {
                //
                // Image file name
                //

                if (inFile == 0)
                    inFile = argv[i];
                else
                    outFile = argv[i];

                i += 1;
            }
        }

        if (inFile == 0 || outFile == 0)
        {
            usageMessage (cerr, argv[0], false);
            return -1;
        }

        if (!strcmp (inFile, outFile))
            throw invalid_argument ("Input and output cannot be the same file");

        //
        // Load inFile, and save a tiled version in outFile.
        //

        //
        // check input
        //
        {
            MultiPartInputFile input (inFile);
            int                parts = input.parts ();

            if (partnum < 0 || partnum >= parts)
            {
                std::stringstream e;
                e << "You asked for part " << partnum << " in " << inFile
                  << ", which only has " << parts << " parts";
                throw invalid_argument (e.str ());
            }

            Header h = input.header (partnum);
            if (h.type () == DEEPTILE || h.type () == DEEPSCANLINE)
                throw invalid_argument ("Cannot make tile for deep data");
        }

        makeTiled (
            inFile,
            outFile,
            partnum,
            mode,
            roundingMode,
            compression,
            tileSizeX,
            tileSizeY,
            doNotFilter,
            extX,
            extY,
            verbose);
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return 1;
    }

    return 0;
}